

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O0

econf_file * init_key_file(void)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  char *local_20;
  char *param;
  econf_file *peStack_10;
  econf_err error;
  econf_file *key_file;
  
  peStack_10 = (econf_file *)0x0;
  local_20 = (char *)0x0;
  iVar1 = asprintf(&local_20,"PARSING_DIRS=%s:%s",usr_root_dir,root_dir);
  if (iVar1 < 0) {
    fprintf(_stderr,"Out of memory!\n");
    exit(1);
  }
  param._4_4_ = econf_newKeyFile_with_options(&stack0xfffffffffffffff0,local_20);
  __stream = _stderr;
  if (param._4_4_ != 0) {
    uVar2 = econf_errString(param._4_4_);
    fprintf(__stream,"ERROR: couldn\'t allocate new key_file: %s\n",uVar2);
    free(local_20);
    exit(1);
  }
  free(local_20);
  return peStack_10;
}

Assistant:

static econf_file *init_key_file(void)
{
    econf_file *key_file = NULL;
    econf_err error;

    char *param = NULL;
    if (asprintf(&param, "PARSING_DIRS=%s:%s", usr_root_dir, root_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
    }

    if ((error = econf_newKeyFile_with_options(&key_file, param)))
    {
      fprintf (stderr, "ERROR: couldn't allocate new key_file: %s\n",
	       econf_errString(error));
      free(param);
      exit(EXIT_FAILURE);
    }

    free(param);
    return key_file;
}